

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::SimplePathSuffixSyntax::SimplePathSuffixSyntax
          (SimplePathSuffixSyntax *this,SeparatedSyntaxList<slang::syntax::NameSyntax> *outputs)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  ulong uVar5;
  long lVar6;
  
  (this->super_PathSuffixSyntax).super_SyntaxNode.kind = SimplePathSuffix;
  (this->super_PathSuffixSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_PathSuffixSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar3 = *(undefined4 *)&(outputs->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (outputs->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->outputs).super_SyntaxListBase.super_SyntaxNode.kind =
       (outputs->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->outputs).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->outputs).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->outputs).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (outputs->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->outputs).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (this->outputs).super_SyntaxListBase.childCount = (outputs->super_SyntaxListBase).childCount;
  (this->outputs).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0062faa8;
  sVar2 = (outputs->elements)._M_extent._M_extent_value;
  (this->outputs).elements._M_ptr = (outputs->elements)._M_ptr;
  (this->outputs).elements._M_extent._M_extent_value = sVar2;
  (this->outputs).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar5 = (this->outputs).elements._M_extent._M_extent_value + 1;
  if (1 < uVar5) {
    uVar5 = uVar5 >> 1;
    lVar6 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->outputs).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar6));
      (*ppSVar4)->parent = (SyntaxNode *)this;
      lVar6 = lVar6 + 0x30;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  return;
}

Assistant:

ArgumentSyntax(SyntaxKind kind) :
        SyntaxNode(kind) {
    }